

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

wchar_t cmd_get_string(command *cmd,char *arg,char **str,char *initial,char *title,char *prompt)

{
  _Bool _Var1;
  wchar_t wVar2;
  char local_98 [8];
  char tmp [80];
  char *prompt_local;
  char *title_local;
  char *initial_local;
  char **str_local;
  char *arg_local;
  command *cmd_local;
  
  memset(local_98,0,0x50);
  wVar2 = cmd_get_arg_string(cmd,arg,str);
  if (wVar2 == L'\0') {
    cmd_local._4_4_ = L'\0';
  }
  else {
    msg("%s",title);
    event_signal(EVENT_MESSAGE_FLUSH);
    if (initial != (char *)0x0) {
      my_strcpy(local_98,initial,0x50);
    }
    _Var1 = get_string(prompt,local_98,0x50);
    if (_Var1) {
      cmd_set_arg_string(cmd,arg,local_98);
      wVar2 = cmd_get_arg_string(cmd,arg,str);
      if (wVar2 == L'\0') {
        return L'\0';
      }
    }
    cmd_local._4_4_ = L'\xfffffffd';
  }
  return cmd_local._4_4_;
}

Assistant:

int cmd_get_string(struct command *cmd, const char *arg, const char **str,
				   const char *initial, const char *title, const char *prompt)
{
	char tmp[80] = "";

	if (cmd_get_arg_string(cmd, arg, str) == CMD_OK)
		return CMD_OK;

	/* Introduce */
	msg("%s", title);
	event_signal(EVENT_MESSAGE_FLUSH);

	/* Prompt properly */
	if (initial)
		my_strcpy(tmp, initial, sizeof tmp);

	if (get_string(prompt, tmp, sizeof tmp)) {
		cmd_set_arg_string(cmd, arg, tmp);
		if (cmd_get_arg_string(cmd, arg, str) == CMD_OK)
			return CMD_OK;
	}

	return CMD_ARG_ABORTED;
}